

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

int ON_Buffer::Compare(ON_Buffer *a,ON_Buffer *b)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool local_4a;
  bool local_49;
  ON_BUFFER_SEGMENT *local_48;
  ON_BUFFER_SEGMENT *local_40;
  
  iVar2 = 0;
  if (a != b) {
    uVar1 = a->m_buffer_size;
    iVar2 = -1;
    if (b->m_buffer_size <= uVar1) {
      if (b->m_buffer_size < uVar1) {
LAB_0045f71a:
        iVar2 = 1;
      }
      else {
        local_40 = a->m_first_segment;
        local_48 = b->m_first_segment;
        local_49 = local_40 != (ON_BUFFER_SEGMENT *)0x0;
        local_4a = local_48 != (ON_BUFFER_SEGMENT *)0x0 && local_49;
        iVar2 = 0;
        if (uVar1 != 0 && (local_48 != (ON_BUFFER_SEGMENT *)0x0 && local_49)) {
          uVar9 = 0;
          uVar7 = 0;
          uVar8 = 0;
          uVar5 = 0;
LAB_0045f76c:
          uVar6 = 0;
LAB_0045f76f:
          if (uVar6 == 0) {
            uVar6 = local_40->m_segment_position1 - local_40->m_segment_position0;
            if (local_40->m_segment_position1 < local_40->m_segment_position0 || uVar6 == 0)
            goto LAB_0045f869;
            uVar8 = 0;
          }
          if (uVar9 == 0) {
            uVar9 = local_48->m_segment_position1 - local_48->m_segment_position0;
            if (local_48->m_segment_position0 <= local_48->m_segment_position1 && uVar9 != 0) {
              uVar7 = 0;
              goto LAB_0045f7a5;
            }
LAB_0045f835:
            local_48 = local_48->m_next_segment;
            local_4a = (bool)(local_48 != (ON_BUFFER_SEGMENT *)0x0 & local_49);
            if (!local_4a) {
              return 0;
            }
            uVar9 = 0;
            if (uVar1 <= uVar5) {
              return 0;
            }
          }
          else {
LAB_0045f7a5:
            uVar4 = uVar6 - uVar8;
            if (uVar6 < uVar8 || uVar4 == 0) goto LAB_0045f869;
            uVar3 = uVar9 - uVar7;
            if (uVar9 < uVar7 || uVar3 == 0) goto LAB_0045f835;
            if (local_40->m_segment_buffer == (uchar *)0x0) {
              return -(uint)(local_48->m_segment_buffer != (uchar *)0x0);
            }
            if (local_48->m_segment_buffer == (uchar *)0x0) goto LAB_0045f71a;
            if (uVar4 < uVar3) {
              uVar3 = uVar4;
            }
            __n = uVar1 - uVar5;
            if (uVar3 + uVar5 <= uVar1) {
              __n = uVar3;
            }
            iVar2 = memcmp(local_40->m_segment_buffer + uVar8,local_48->m_segment_buffer + uVar7,__n
                          );
            if (iVar2 != 0) {
              return iVar2 >> 0x1f | 1;
            }
            uVar8 = uVar8 + __n;
            uVar7 = uVar7 + __n;
            uVar5 = uVar5 + __n;
            if (!(bool)(local_4a & uVar5 < uVar1)) {
              return 0;
            }
          }
          goto LAB_0045f76f;
        }
      }
    }
  }
  return iVar2;
LAB_0045f869:
  local_40 = local_40->m_next_segment;
  local_49 = local_40 != (ON_BUFFER_SEGMENT *)0x0;
  local_4a = local_48 != (ON_BUFFER_SEGMENT *)0x0 && local_49;
  if (local_48 == (ON_BUFFER_SEGMENT *)0x0 || !local_49) {
    return 0;
  }
  if (uVar1 <= uVar5) {
    return 0;
  }
  goto LAB_0045f76c;
}

Assistant:

int ON_Buffer::Compare( const ON_Buffer& a, const ON_Buffer& b )
{
  if ( &a == &b )
    return 0;
  if ( a.m_buffer_size < b.m_buffer_size )
    return -1;
  if ( a.m_buffer_size > b.m_buffer_size )
    return 1;

  struct ON_BUFFER_SEGMENT* aseg = a.m_first_segment;
  struct ON_BUFFER_SEGMENT* bseg = b.m_first_segment;
  const ON__UINT64 buffer_size = a.m_buffer_size;
  ON__UINT64 size = 0;
  size_t aoffset = 0;
  size_t boffset = 0;
  size_t asegsize = 0;
  size_t bsegsize = 0;  
  size_t asize = 0;
  size_t bsize = 0;  
  size_t sz;
  int rc = 0;

  while ( 0 != aseg && 0 != bseg && size < buffer_size )
  {
    if ( 0 == asegsize )
    {
      if ( aseg->m_segment_position0 >= aseg->m_segment_position1 )
      {
        aseg = aseg->m_next_segment;
        continue;
      }
      asegsize = (size_t)(aseg->m_segment_position1 - aseg->m_segment_position0);
      aoffset = 0;
    }

    if ( 0 == bsegsize )
    {
      if ( bseg->m_segment_position0 >= bseg->m_segment_position1 )
      {
        bseg = bseg->m_next_segment;
        continue;
      }
      bsegsize = (size_t)(bseg->m_segment_position1 - bseg->m_segment_position0);
      boffset = 0;
    }
    
    if ( aoffset >= asegsize )
    {
      asegsize = 0;
      aseg = aseg->m_next_segment;
      continue;
    }

    if ( boffset >= bsegsize )
    {
      bsegsize = 0;
      bseg = bseg->m_next_segment;
      continue;
    }

    if ( 0 == aseg->m_segment_buffer )
    {
      return (0 == bseg->m_segment_buffer) ? 0 : -1;
    }

    if ( 0 == bseg->m_segment_buffer )
    {
      return 1;
    }

    asize = asegsize - aoffset;
    bsize = bsegsize - boffset;
    sz = (asize <= bsize) ? asize : bsize;
    if ( size + sz > buffer_size )
      sz = (size_t)(buffer_size - size);
    rc = memcmp( aseg->m_segment_buffer + aoffset, bseg->m_segment_buffer + boffset, (size_t)sz );
    if ( 0 != rc )
      return ((rc<0)?-1:1);
    aoffset += sz;
    boffset += sz;
    size += sz;
  }

  return 0;
}